

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapequad.cpp
# Opt level: O1

void pzshape::TPZShapeQuad::TransformPoint2dQ
               (int transid,TPZVec<Fad<double>_> *in,TPZVec<Fad<double>_> *out)

{
  long lVar1;
  FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>
  local_80;
  FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> local_70;
  FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> local_50;
  
  lVar1 = (long)transid * 0x20;
  local_50.fadexpr_.right_ = in->fStore;
  local_50.fadexpr_.left_.constant_ = *(double *)(gTrans2dQ + lVar1);
  local_70.fadexpr_.left_.constant_ = *(double *)(gTrans2dQ + lVar1 + 8);
  local_50.fadexpr_.left_.defaultVal = 0.0;
  local_70.fadexpr_.right_ = local_50.fadexpr_.right_ + 1;
  local_70.fadexpr_.left_.defaultVal = 0.0;
  local_80.fadexpr_.left_ = &local_50;
  local_80.fadexpr_.right_ = &local_70;
  Fad<double>::operator=(out->fStore,&local_80);
  local_50.fadexpr_.right_ = in->fStore;
  local_50.fadexpr_.left_.constant_ = *(double *)(gTrans2dQ + lVar1 + 0x10);
  local_70.fadexpr_.left_.constant_ = *(double *)(gTrans2dQ + lVar1 + 0x18);
  local_50.fadexpr_.left_.defaultVal = 0.0;
  local_70.fadexpr_.right_ = local_50.fadexpr_.right_ + 1;
  local_70.fadexpr_.left_.defaultVal = 0.0;
  local_80.fadexpr_.left_ = &local_50;
  local_80.fadexpr_.right_ = &local_70;
  Fad<double>::operator=(out->fStore + 1,&local_80);
  return;
}

Assistant:

void TPZShapeQuad::TransformPoint2dQ(int transid, TPZVec<FADREAL> &in, TPZVec<FADREAL> &out) {
		
		out[0] = gTrans2dQ[transid][0][0]*in[0]+gTrans2dQ[transid][0][1]*in[1];//Cedric 23/02/99
		out[1] = gTrans2dQ[transid][1][0]*in[0]+gTrans2dQ[transid][1][1]*in[1];//Cedric 23/02/99
	}